

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O2

bool __thiscall
Gudhi::Simplex_tree<MyOptions>::prune_above_filtration
          (Simplex_tree<MyOptions> *this,Filtration_value *filtration)

{
  pointer pvVar1;
  bool bVar2;
  
  if ((*filtration < INFINITY) &&
     (bVar2 = rec_prune_above_filtration(this,&this->root_,filtration), bVar2)) {
    pvVar1 = (this->filtration_vect_).
             super__Vector_base<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MyOptions>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MyOptions>_>_>_*,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((this->filtration_vect_).
        super__Vector_base<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MyOptions>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MyOptions>_>_>_*,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_finish == pvVar1) {
      return true;
    }
    (this->filtration_vect_).
    super__Vector_base<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MyOptions>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MyOptions>_>_>_*,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pvVar1;
    return true;
  }
  return false;
}

Assistant:

bool prune_above_filtration(const Filtration_value& filtration) {
    if (filtration == Filtration_simplex_base_real::get_infinity())
      return false;  // ---->>
    bool modified = rec_prune_above_filtration(root(), filtration);
    if(modified)
      clear_filtration(); // Drop the cache.
    return modified;
  }